

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eve.cpp
# Opt level: O0

void eve::readevents(vector<int,_std::allocator<int>_> *events)

{
  size_t sVar1;
  value_type local_1c;
  FILE *pFStack_18;
  int eventid;
  FILE *fin;
  vector<int,_std::allocator<int>_> *events_local;
  
  fin = (FILE *)events;
  pFStack_18 = fopen("input/events.bin","rb");
  if (pFStack_18 != (FILE *)0x0) {
    while (sVar1 = fread(&local_1c,4,1,pFStack_18), sVar1 == 1) {
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)fin,&local_1c);
    }
    fclose(pFStack_18);
    return;
  }
  fprintf(_stderr,"FATAL: %s: %s: cannot open %s\n",progname,"readevents","input/events.bin");
  exit(1);
}

Assistant:

void readevents(std::vector<int> &events) {
        FILE *fin = fopen(EVENTS_FILE, "rb");
        if (fin == NULL) {
            fprintf(stderr, "FATAL: %s: %s: cannot open %s\n", progname, __func__,
                    EVENTS_FILE);
            exit(EXIT_FAILURE);
        }
        int eventid;
        while (fread(&eventid, sizeof(eventid), 1, fin) == 1) {
            events.push_back(eventid);
        }
        fclose(fin);
    }